

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O3

void __thiscall duckdb::UndoBuffer::Rollback(UndoBuffer *this)

{
  UndoFlags UVar1;
  BufferManager *pBVar2;
  reference pvVar3;
  _Head_base<0UL,_duckdb::UndoBufferEntry_*,_false> _Var4;
  UndoFlags *pUVar5;
  size_type __n;
  data_ptr_t start;
  vector<std::pair<duckdb::UndoFlags,_unsigned_char_*>,_true> nodes;
  RollbackState state;
  BufferHandle handle;
  UndoFlags *local_88;
  UndoFlags local_7c;
  void *local_78;
  long lStack_70;
  undefined8 local_68;
  UndoBuffer *local_60;
  UndoBufferEntry *local_58;
  RollbackState local_50;
  BufferHandle local_48;
  
  RollbackState::RollbackState(&local_50,this->transaction);
  _Var4._M_head_impl =
       (this->allocator).head.
       super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
       .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
  if (_Var4._M_head_impl != (UndoBufferEntry *)0x0) {
    local_60 = this;
    do {
      pBVar2 = (local_60->allocator).buffer_manager;
      (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&(_Var4._M_head_impl)->block);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.node);
      local_88 = (UndoFlags *)(local_48.node.ptr)->buffer;
      local_78 = (void *)0x0;
      lStack_70 = 0;
      local_68 = 0;
      local_58 = _Var4._M_head_impl;
      if ((long)(_Var4._M_head_impl)->position < 1) {
        __n = 0;
      }
      else {
        pUVar5 = (UndoFlags *)((_Var4._M_head_impl)->position + (long)local_88);
        do {
          local_7c = *local_88;
          UVar1 = local_88[1];
          local_88 = local_88 + 2;
          ::std::
          vector<std::pair<duckdb::UndoFlags,unsigned_char*>,std::allocator<std::pair<duckdb::UndoFlags,unsigned_char*>>>
          ::emplace_back<duckdb::UndoFlags&,unsigned_char*&>
                    ((vector<std::pair<duckdb::UndoFlags,unsigned_char*>,std::allocator<std::pair<duckdb::UndoFlags,unsigned_char*>>>
                      *)&local_78,&local_7c,(uchar **)&local_88);
          local_88 = (UndoFlags *)((ulong)UVar1 + (long)local_88);
        } while (local_88 < pUVar5);
        __n = lStack_70 - (long)local_78 >> 4;
      }
      while (__n = __n - 1, __n != 0xffffffffffffffff) {
        pvVar3 = vector<std::pair<duckdb::UndoFlags,_unsigned_char_*>,_true>::operator[]
                           ((vector<std::pair<duckdb::UndoFlags,_unsigned_char_*>,_true> *)&local_78
                            ,__n);
        UVar1 = pvVar3->first;
        pvVar3 = vector<std::pair<duckdb::UndoFlags,_unsigned_char_*>,_true>::operator[]
                           ((vector<std::pair<duckdb::UndoFlags,_unsigned_char_*>,_true> *)&local_78
                            ,__n);
        RollbackState::RollbackEntry(&local_50,UVar1,pvVar3->second);
      }
      _Var4._M_head_impl =
           (local_58->next).
           super_unique_ptr<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::UndoBufferEntry,_std::default_delete<duckdb::UndoBufferEntry>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::UndoBufferEntry_*,_std::default_delete<duckdb::UndoBufferEntry>_>
           .super__Head_base<0UL,_duckdb::UndoBufferEntry_*,_false>._M_head_impl;
      if (local_78 != (void *)0x0) {
        operator_delete(local_78);
      }
      BufferHandle::~BufferHandle(&local_48);
    } while (_Var4._M_head_impl != (UndoBufferEntry *)0x0);
  }
  return;
}

Assistant:

void UndoBuffer::Rollback() {
	// rollback needs to be performed in reverse
	RollbackState state(transaction);
	ReverseIterateEntries([&](UndoFlags type, data_ptr_t data) { state.RollbackEntry(type, data); });
}